

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall
chrono::ChFile_ps::DrawText
          (ChFile_ps *this,ChVector2<double> *mfrom,char *string,Space space,Justification justified
          )

{
  ChStreamOutAscii *this_00;
  char *str;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_50.m_data[0] = mfrom->m_data[0];
  local_50.m_data[1] = mfrom->m_data[1];
  TransPt(this,&local_50,space);
  MoveTo(this,&local_40);
  ChStreamOutAscii::operator<<(this_00,"(");
  ChStreamOutAscii::operator<<(this_00,string);
  if (justified < (CENTER|RIGHT)) {
    str = &DAT_0097f17c + *(int *)(&DAT_0097f17c + (ulong)justified * 4);
  }
  else {
    str = ") show \n";
  }
  ChStreamOutAscii::operator<<(this_00,str);
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  return;
}

Assistant:

void ChFile_ps::DrawText(ChVector2<> mfrom, char* string, Space space, Justification justified) {
    GrSave();
    MoveTo(TransPt(mfrom, space));
    *this << "(";
    *this << string;
    switch (justified) {
        case Justification::LEFT:
            *this << ") show \n";
            break;
        case Justification::RIGHT:
            *this << ") dup stringwidth pop neg 0 rmoveto show \n";
            break;
        case Justification::CENTER:
            *this << ") dup stringwidth pop 2 div neg 0 rmoveto show \n";
            break;
        default:
            *this << ") show \n";
    }
    GrRestore();
}